

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void cp_reg_check_reset(gpointer key,gpointer value,gpointer opaque)

{
  CPUARMState_conflict *env;
  uint64_t uVar1;
  uint64_t uVar2;
  CPUARMState_conflict *key_00;
  
  if ((*(byte *)((long)value + 0x14) & 0xa1) == 0) {
    env = (CPUARMState_conflict *)((long)opaque + 0xa350);
    key_00 = env;
    uVar1 = read_raw_cp_reg_aarch64(env,(ARMCPRegInfo_conflict *)value);
    cp_reg_reset(key_00,value,opaque);
    uVar2 = read_raw_cp_reg_aarch64(env,(ARMCPRegInfo_conflict *)value);
    if (uVar1 != uVar2) {
      __assert_fail("oldvalue == newvalue",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                    ,0x92,"void cp_reg_check_reset(gpointer, gpointer, gpointer)");
    }
  }
  return;
}

Assistant:

static void cp_reg_check_reset(gpointer key, gpointer value,  gpointer opaque)
{
    /* Purely an assertion check: we've already done reset once,
     * so now check that running the reset for the cpreg doesn't
     * change its value. This traps bugs where two different cpregs
     * both try to reset the same state field but to different values.
     */
    ARMCPRegInfo *ri = value;
#ifndef NDEBUG
    ARMCPU *cpu = opaque;
    uint64_t oldvalue, newvalue;
#endif

    if (ri->type & (ARM_CP_SPECIAL | ARM_CP_ALIAS | ARM_CP_NO_RAW)) {
        return;
    }

#ifndef NDEBUG
    oldvalue = read_raw_cp_reg(&cpu->env, ri);
#endif
    cp_reg_reset(key, value, opaque);
#ifndef NDEBUG
    newvalue = read_raw_cp_reg(&cpu->env, ri);
    assert(oldvalue == newvalue);
#endif
}